

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall
Js::JSONStringifier::ReadArrayElement
          (JSONStringifier *this,uint32 index,RecyclableObject *arr,JSONProperty *prop,
          JSONObjectStack *objectStack)

{
  int iVar1;
  JavascriptArray *pJVar2;
  undefined4 extraout_var;
  JavascriptString *key;
  Var local_38;
  Var value;
  
  local_38 = (Var)0x0;
  pJVar2 = JavascriptArray::TryVarToNonES5Array(arr);
  if (pJVar2 != (JavascriptArray *)0x0) {
    iVar1 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar2);
    if (iVar1 == 0) {
      iVar1 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar2,(ulong)index);
      local_38 = (Var)CONCAT44(extraout_var,iVar1);
      goto LAB_00b66ae5;
    }
  }
  JavascriptOperators::GetItem(arr,index,&local_38,this->scriptContext);
LAB_00b66ae5:
  key = ScriptContext::GetIntegerString(this->scriptContext,index);
  ReadProperty(this,key,arr,prop,local_38,objectStack);
  return;
}

Assistant:

void
JSONStringifier::ReadArrayElement(uint32 index, _In_ RecyclableObject* arr, _Out_ JSONProperty* prop, _In_ JSONObjectStack* objectStack)
{
    Var value = nullptr;
    JavascriptArray* jsArray = JavascriptArray::TryVarToNonES5Array(arr);
    if (jsArray && !jsArray->IsCrossSiteObject())
    {
        value = jsArray->DirectGetItem(index);
    }
    else
    {
        JavascriptOperators::GetItem(arr, index, &value, this->scriptContext);
    }
    JavascriptString* indexString = this->scriptContext->GetIntegerString(index);
    this->ReadProperty(indexString, arr, prop, value, objectStack);
}